

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::returnStmt(Parse *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  KeyWordTable *pKVar2;
  DelimiterTable *pDVar3;
  int iVar4;
  mapped_type *pmVar5;
  pointer pTVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  key_type local_48;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type != KEYWORD) {
    return 0;
  }
  pKVar2 = this->keyWordTable;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"return","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&(pKVar2->
                         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ).index,&local_48);
  iVar9 = *pmVar5;
  iVar4 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].id;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (iVar9 != iVar4) {
    return 0;
  }
  this->curIndex = this->curIndex + 1;
  iVar4 = expression(this);
  iVar9 = *(int *)(*(long *)&(this->st->symbolTable).
                             super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                             super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                             ._M_impl.super__Vector_impl_data + 0x20);
  if (iVar4 == 0) {
    if (iVar9 != 7) {
      pcVar10 = anon_var_dwarf_33dca;
      goto LAB_0010d21a;
    }
    std::vector<QuadTuple,std::allocator<QuadTuple>>::
    emplace_back<char_const(&)[7],char_const(&)[3],char_const(&)[3],char_const(&)[3]>
              ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return",
               (char (*) [3])"__",(char (*) [3])"__",(char (*) [3])"__");
  }
  else {
    if (iVar9 == 7) {
      pcVar10 = anon_var_dwarf_33dd6;
LAB_0010d21a:
      poVar7 = std::operator<<((ostream *)&std::cout,pcVar10);
      iVar9 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].line;
      goto LAB_0010d239;
    }
    std::vector<QuadTuple,std::allocator<QuadTuple>>::
    emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
              ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return",
               &this->expName,(char (*) [3])"__",(char (*) [3])"__");
  }
  lVar8 = (long)this->curIndex;
  pTVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar6[lVar8].type == DELIMTER) {
    pDVar3 = this->delimiterTable;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,anon_var_dwarf_33b7a + 0x12,anon_var_dwarf_33b7a + 0x13);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar3->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_48);
    iVar9 = *pmVar5;
    iVar4 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (iVar9 == iVar4) {
      this->curIndex = this->curIndex + 1;
      return 1;
    }
    lVar8 = (long)this->curIndex;
    pTVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::operator<<((ostream *)&std::cout,(string *)&pTVar6[lVar8].name);
  poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_33df0);
  iVar9 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].line + -1;
LAB_0010d239:
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
  poVar7 = std::operator<<(poVar7,anon_var_dwarf_33a7e);
  std::endl<char,std::char_traits<char>>(poVar7);
  exit(0);
}

Assistant:

int Parse::returnStmt() {
    if(tokenVec[curIndex].type == KEYWORD && keyWordTable.index["return"] == tokenVec[curIndex].id) {
        curIndex++;
        if(!expression()) {
            Type returnType = st.symbolTable[curFun][0].type;
            //cout << returnType << endl;
            if(returnType != Type::VOID) {
                cout << "函数类型需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            quadVec.emplace_back("return", "__", "__", "__");
        } else {
            Type returnType = st.symbolTable[curFun][0].type;
//            cout << returnType << endl;
            if(returnType == Type::VOID) {
                cout << "函数类型是void 不需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            //return语句四元式设计
            quadVec.emplace_back("return", expName, "__", "__");
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << tokenVec[curIndex].name;
            cout<<"return 语句缺少';'在第" << tokenVec[curIndex].line -1 << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}